

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

pair<unsigned_int,_unsigned_int>
deqp::gls::anon_unknown_1::createAndAttachShaders
          (TestLog *log,RenderContext *renderCtx,deUint32 program,
          vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
          *attributes,bool attributeAliasing)

{
  _Rb_tree_header *p_Var1;
  Functions *pFVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType CVar6;
  GLSLVersion GVar7;
  GLuint shader;
  GLenum GVar8;
  undefined4 extraout_var;
  ostream *poVar9;
  _Base_ptr p_Var10;
  mapped_type *pmVar11;
  pair<unsigned_int,_unsigned_int> pVar12;
  TestError *this;
  deUint32 shader_00;
  char *pcVar13;
  GLSLVersion version;
  pointer pAVar14;
  char *pcVar15;
  Cond *pCVar16;
  undefined7 in_register_00000081;
  int i;
  uint uVar17;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conditions;
  allocator<char> local_485;
  deUint32 local_484;
  Functions *local_480;
  pointer local_478;
  char *local_470;
  int local_468;
  GLSLVersion local_464;
  ScopedLogSection infoLogSection;
  string fragmentShaderInfoLog;
  string fragmentShaderSource;
  ScopedLogSection shaderSection;
  StringTemplate vertexShaderTemplate;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parameters;
  string local_228;
  string vertexShaderSource;
  ostringstream src;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar13 = (char *)attributes;
  local_484 = program;
  iVar5 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  local_480 = (Functions *)CONCAT44(extraout_var,iVar5);
  CVar6.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  GVar7 = glu::getContextTypeGLSLVersion(CVar6);
  local_468 = (int)CONCAT71(in_register_00000081,attributeAliasing);
  if (local_468 == 0) {
LAB_00875360:
    local_464 = GVar7;
  }
  else {
    bVar3 = glu::glslVersionIsES(GVar7);
    local_464 = GLSL_VERSION_100_ES;
    if (!bVar3) goto LAB_00875360;
  }
  glu::glslVersionUsesInOutQualifiers(local_464);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  std::operator<<((ostream *)&src,"${VERSION}\n${VTX_OUTPUT} mediump vec4 v_color;\n");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&parameters);
  pAVar14 = (attributes->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_470 = "";
  for (; pAVar14 !=
         (attributes->
         super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
         )._M_impl.super__Vector_impl_data._M_finish; pAVar14 = pAVar14 + 1) {
    if (pAVar14->m_layoutLocation != -1) {
      poVar9 = std::operator<<((ostream *)&parameters,"layout(location = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pAVar14->m_layoutLocation);
      std::operator<<(poVar9,") ");
    }
    poVar9 = std::operator<<((ostream *)&parameters,"${VTX_INPUT} mediump ");
    AttributeLocationTestUtil::AttribType::AttribType((AttribType *)&conditions,&pAVar14->m_type);
    poVar9 = std::operator<<(poVar9,(string *)&conditions);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,(string *)&pAVar14->m_name);
    iVar5 = pAVar14->m_arraySize;
    local_478 = pAVar14;
    if (iVar5 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fragmentShaderSource,"",&local_485);
    }
    else {
      fragmentShaderInfoLog._M_dataplus._M_p._0_4_ = iVar5;
      de::toString<int>(&local_70,(int *)&fragmentShaderInfoLog);
      std::operator+(&local_50,"[",&local_70);
      std::operator+(&fragmentShaderSource,&local_50,"]");
    }
    poVar9 = std::operator<<(poVar9,(string *)&fragmentShaderSource);
    std::operator<<(poVar9,";\n");
    std::__cxx11::string::~string((string *)&fragmentShaderSource);
    if (iVar5 != -1) {
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    pAVar14 = local_478;
    std::__cxx11::string::~string((string *)&conditions);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&parameters);
  poVar9 = std::operator<<((ostream *)&src,(string *)&shaderSection);
  local_478 = (pointer)std::operator<<(poVar9,"\n");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&parameters);
  conditions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &conditions._M_t._M_impl.super__Rb_tree_header._M_header;
  conditions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  conditions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  conditions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  conditions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       conditions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pAVar14 = (attributes->
                 super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pAVar14 !=
      (attributes->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      )._M_impl.super__Vector_impl_data._M_finish; pAVar14 = pAVar14 + 1) {
    AttributeLocationTestUtil::Cond::Cond((Cond *)&fragmentShaderSource,COND_NEVER);
    bVar3 = AttributeLocationTestUtil::Cond::operator!=
                      (&pAVar14->m_cond,(Cond *)&fragmentShaderSource);
    pCVar16 = (Cond *)&fragmentShaderSource._M_string_length;
    if (bVar3) {
      AttributeLocationTestUtil::Cond::Cond((Cond *)&fragmentShaderInfoLog,COND_ALWAYS);
      bVar3 = AttributeLocationTestUtil::Cond::operator!=
                        (&pAVar14->m_cond,(Cond *)&fragmentShaderInfoLog);
      std::__cxx11::string::~string((string *)&fragmentShaderInfoLog._M_string_length);
      std::__cxx11::string::~string((string *)&fragmentShaderSource._M_string_length);
      if (bVar3) {
        std::__cxx11::string::string
                  ((string *)&fragmentShaderSource,(string *)&(pAVar14->m_cond).m_name);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&conditions,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fragmentShaderSource);
        pCVar16 = (Cond *)&fragmentShaderSource;
        goto LAB_00875630;
      }
    }
    else {
LAB_00875630:
      std::__cxx11::string::~string((string *)pCVar16);
    }
  }
  for (p_Var10 = conditions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &conditions._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    poVar9 = std::operator<<((ostream *)&parameters,"uniform mediump float u_");
    poVar9 = std::operator<<(poVar9,(string *)(p_Var10 + 1));
    std::operator<<(poVar9,";\n");
  }
  std::__cxx11::stringbuf::str();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&conditions._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&parameters);
  poVar9 = std::operator<<((ostream *)local_478,(string *)&infoLogSection);
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)&infoLogSection);
  std::__cxx11::string::~string((string *)&shaderSection);
  std::operator<<((ostream *)&src,"void main (void)\n{\n\tmediump vec4 color = vec4(0.0);\n\n");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&parameters);
  for (pAVar14 = (attributes->
                 super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pAVar14 !=
      (attributes->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      )._M_impl.super__Vector_impl_data._M_finish; pAVar14 = pAVar14 + 1) {
    AttributeLocationTestUtil::Cond::Cond((Cond *)&conditions,COND_NEVER);
    pCVar16 = &pAVar14->m_cond;
    bVar3 = AttributeLocationTestUtil::Cond::operator==(pCVar16,(Cond *)&conditions);
    std::__cxx11::string::~string((string *)&conditions._M_t._M_impl.super__Rb_tree_header);
    if (bVar3) {
      std::operator<<((ostream *)&parameters,"\tif (0 != 0)\n\t{\n");
      iVar5 = pAVar14->m_arraySize;
      if (iVar5 == -1) {
        poVar9 = std::operator<<((ostream *)&parameters,"\t\tcolor += ");
        (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                  ((string *)&conditions,(_anonymous_namespace_ *)pAVar14,
                   (Attribute *)0xffffffffffffffff,(int)pcVar13);
        poVar9 = std::operator<<(poVar9,(string *)&conditions);
        std::operator<<(poVar9,";\n");
LAB_008759c6:
        std::__cxx11::string::~string((string *)&conditions);
      }
      else {
        for (uVar17 = 0; (int)uVar17 < iVar5; uVar17 = uVar17 + 1) {
          poVar9 = std::operator<<((ostream *)&parameters,"\t\tcolor += ");
          (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                    ((string *)&conditions,(_anonymous_namespace_ *)pAVar14,
                     (Attribute *)(ulong)uVar17,(int)pcVar13);
          poVar9 = std::operator<<(poVar9,(string *)&conditions);
          std::operator<<(poVar9,";\n");
          std::__cxx11::string::~string((string *)&conditions);
          iVar5 = pAVar14->m_arraySize;
        }
      }
LAB_008759ce:
      std::operator<<((ostream *)&parameters,"\t}\n");
    }
    else {
      AttributeLocationTestUtil::Cond::Cond((Cond *)&conditions,COND_ALWAYS);
      bVar3 = AttributeLocationTestUtil::Cond::operator==(pCVar16,(Cond *)&conditions);
      std::__cxx11::string::~string((string *)&conditions._M_t._M_impl.super__Rb_tree_header);
      if (!bVar3) {
        poVar9 = std::operator<<((ostream *)&parameters,"\tif (u_");
        std::__cxx11::string::string((string *)&conditions,(string *)&(pAVar14->m_cond).m_name);
        poVar9 = std::operator<<(poVar9,(string *)&conditions);
        pcVar15 = " == ";
        pcVar13 = " != ";
        if (pCVar16->m_negate != false) {
          pcVar15 = " != ";
        }
        poVar9 = std::operator<<(poVar9,pcVar15);
        std::operator<<(poVar9,"0.0)\n\t{\n");
        std::__cxx11::string::~string((string *)&conditions);
        iVar5 = pAVar14->m_arraySize;
        if (iVar5 == -1) {
          poVar9 = std::operator<<((ostream *)&parameters,"\t\tcolor += ");
          (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                    ((string *)&conditions,(_anonymous_namespace_ *)pAVar14,
                     (Attribute *)0xffffffffffffffff,(int)pcVar13);
          poVar9 = std::operator<<(poVar9,(string *)&conditions);
          std::operator<<(poVar9,";\n");
          goto LAB_008759c6;
        }
        for (uVar17 = 0; (int)uVar17 < iVar5; uVar17 = uVar17 + 1) {
          poVar9 = std::operator<<((ostream *)&parameters,"\t\tcolor += ");
          (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                    ((string *)&conditions,(_anonymous_namespace_ *)pAVar14,
                     (Attribute *)(ulong)uVar17,(int)pcVar13);
          poVar9 = std::operator<<(poVar9,(string *)&conditions);
          std::operator<<(poVar9,";\n");
          std::__cxx11::string::~string((string *)&conditions);
          iVar5 = pAVar14->m_arraySize;
        }
        goto LAB_008759ce;
      }
      iVar5 = pAVar14->m_arraySize;
      if (iVar5 == -1) {
        poVar9 = std::operator<<((ostream *)&parameters,"\tcolor += ");
        (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                  ((string *)&conditions,(_anonymous_namespace_ *)pAVar14,
                   (Attribute *)0xffffffffffffffff,(int)pcVar13);
        poVar9 = std::operator<<(poVar9,(string *)&conditions);
        std::operator<<(poVar9,";\n");
        std::__cxx11::string::~string((string *)&conditions);
      }
      else {
        for (uVar17 = 0; (int)uVar17 < iVar5; uVar17 = uVar17 + 1) {
          poVar9 = std::operator<<((ostream *)&parameters,"\tcolor += ");
          (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                    ((string *)&conditions,(_anonymous_namespace_ *)pAVar14,
                     (Attribute *)(ulong)uVar17,(int)pcVar13);
          poVar9 = std::operator<<(poVar9,(string *)&conditions);
          std::operator<<(poVar9,";\n");
          std::__cxx11::string::~string((string *)&conditions);
          iVar5 = pAVar14->m_arraySize;
        }
      }
    }
  }
  p_Var1 = &parameters._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&parameters);
  std::operator<<((ostream *)&src,(string *)&fragmentShaderSource);
  std::__cxx11::string::~string((string *)&fragmentShaderSource);
  std::operator<<((ostream *)&src,"\n\tv_color = color;\n\tgl_Position = color;\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  tcu::StringTemplate::StringTemplate(&vertexShaderTemplate,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parameters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  glu::getGLSLVersionDeclaration(local_464);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"VERSION",(allocator<char> *)&conditions);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&src);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"VTX_OUTPUT",(allocator<char> *)&conditions);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&src);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"VTX_INPUT",(allocator<char> *)&conditions);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&src);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"FRAG_INPUT",(allocator<char> *)&conditions);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&src);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"FRAG_OUTPUT_VAR",(allocator<char> *)&conditions);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&src);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"FRAG_OUTPUT_DECLARATION",(allocator<char> *)&conditions);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&src);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&src);
  tcu::StringTemplate::specialize(&vertexShaderSource,&vertexShaderTemplate,&parameters);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&parameters._M_t);
  tcu::StringTemplate::~StringTemplate(&vertexShaderTemplate);
  CVar6.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])();
  GVar7 = glu::getContextTypeGLSLVersion(CVar6);
  if ((char)local_468 != '\0') {
    bVar3 = glu::glslVersionIsES(GVar7);
    version = GLSL_VERSION_100_ES;
    if (bVar3) goto LAB_00875d34;
  }
  version = GVar7;
LAB_00875d34:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parameters,
             "${VERSION}\n${FRAG_OUTPUT_DECLARATION}\n${FRAG_INPUT} mediump vec4 v_color;\nvoid main (void)\n{\n\t${FRAG_OUTPUT_VAR} = v_color;\n}\n"
             ,(allocator<char> *)&conditions);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&src,(string *)&parameters);
  std::__cxx11::string::~string((string *)&parameters);
  bVar3 = glu::glslVersionUsesInOutQualifiers(version);
  parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parameters._M_t._M_impl.super__Rb_tree_header._M_header;
  parameters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conditions,"VERSION",(allocator<char> *)&fragmentShaderInfoLog);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&conditions);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&conditions);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conditions,"VTX_OUTPUT",(allocator<char> *)&fragmentShaderInfoLog);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&conditions);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&conditions);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conditions,"VTX_INPUT",(allocator<char> *)&fragmentShaderInfoLog);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&conditions);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&conditions);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conditions,"FRAG_INPUT",(allocator<char> *)&fragmentShaderInfoLog);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&conditions);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&conditions);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conditions,"FRAG_OUTPUT_VAR",(allocator<char> *)&fragmentShaderInfoLog);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&conditions);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&conditions);
  if (bVar3) {
    local_470 = "layout(location=0) out mediump vec4 dEQP_FragColor;";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conditions,"FRAG_OUTPUT_DECLARATION",
             (allocator<char> *)&fragmentShaderInfoLog);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&parameters,(key_type *)&conditions);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&conditions);
  tcu::StringTemplate::specialize(&fragmentShaderSource,(StringTemplate *)&src,&parameters);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&parameters._M_t);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&src);
  pFVar2 = local_480;
  pVar12.first = (*local_480->createShader)(0x8b31);
  shader = (*pFVar2->createShader)(0x8b30);
  GVar8 = (*pFVar2->getError)();
  glu::checkError(GVar8,"glCreateShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1a7);
  parameters._M_t._M_impl._0_8_ = vertexShaderSource._M_dataplus._M_p;
  _src = fragmentShaderSource._M_dataplus._M_p;
  (*pFVar2->shaderSource)(pVar12.first,1,(GLchar **)&parameters,(GLint *)0x0);
  (*pFVar2->shaderSource)(shader,1,(GLchar **)&src,(GLint *)0x0);
  GVar8 = (*pFVar2->getError)();
  glu::checkError(GVar8,"glShaderSource()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b0);
  (*pFVar2->compileShader)(pVar12.first);
  (*pFVar2->compileShader)(shader);
  GVar8 = (*pFVar2->getError)();
  glu::checkError(GVar8,"glCompileShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b5);
  (*pFVar2->attachShader)(local_484,pVar12.first);
  (*pFVar2->attachShader)(local_484,shader);
  GVar8 = (*pFVar2->getError)();
  shader_00 = 0x1b9;
  glu::checkError(GVar8,"glAttachShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b9);
  bVar3 = getShaderCompileStatus(pFVar2,pVar12.first);
  bVar4 = getShaderCompileStatus(pFVar2,shader);
  (anonymous_namespace)::getShaderInfoLog_abi_cxx11_
            ((string *)&conditions,(_anonymous_namespace_ *)pFVar2,(Functions *)(ulong)pVar12.first,
             shader_00);
  (anonymous_namespace)::getShaderInfoLog_abi_cxx11_
            (&fragmentShaderInfoLog,(_anonymous_namespace_ *)pFVar2,(Functions *)(ulong)shader,
             shader_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parameters,"Vertex Shader Info",(allocator<char> *)&infoLogSection);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"Vertex Shader Info",(allocator<char> *)&vertexShaderTemplate);
  tcu::ScopedLogSection::ScopedLogSection(&shaderSection,log,(string *)&parameters,(string *)&src);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::~string((string *)&parameters);
  std::__cxx11::string::string((string *)&parameters,(string *)&vertexShaderSource);
  tcu::TestLog::writeKernelSource(log,(char *)parameters._M_t._M_impl._0_8_);
  std::__cxx11::string::~string((string *)&parameters);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parameters,"Info Log",(allocator<char> *)&vertexShaderTemplate);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"Info Log",(allocator<char> *)&local_228);
  tcu::ScopedLogSection::ScopedLogSection(&infoLogSection,log,(string *)&parameters,(string *)&src);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::~string((string *)&parameters);
  p_Var1 = &parameters._M_t._M_impl.super__Rb_tree_header;
  parameters._M_t._M_impl._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
  std::operator<<((ostream *)p_Var1,(string *)&conditions);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&parameters,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var1);
  tcu::ScopedLogSection::~ScopedLogSection(&infoLogSection);
  p_Var1 = &parameters._M_t._M_impl.super__Rb_tree_header;
  parameters._M_t._M_impl._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
  std::operator<<((ostream *)p_Var1,"Compilation result: ");
  pcVar15 = "Failed";
  pcVar13 = "Failed";
  if (bVar3) {
    pcVar13 = "Ok";
  }
  std::operator<<((ostream *)p_Var1,pcVar13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&parameters,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var1);
  tcu::ScopedLogSection::~ScopedLogSection(&shaderSection);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parameters,"Fragment Shader Info",(allocator<char> *)&infoLogSection);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"Fragment Shader Info",(allocator<char> *)&vertexShaderTemplate);
  tcu::ScopedLogSection::ScopedLogSection(&shaderSection,log,(string *)&parameters,(string *)&src);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::~string((string *)&parameters);
  std::__cxx11::string::string((string *)&parameters,(string *)&fragmentShaderSource);
  tcu::TestLog::writeKernelSource(log,(char *)parameters._M_t._M_impl._0_8_);
  std::__cxx11::string::~string((string *)&parameters);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parameters,"Info Log",(allocator<char> *)&vertexShaderTemplate);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"Info Log",(allocator<char> *)&local_228);
  tcu::ScopedLogSection::ScopedLogSection(&infoLogSection,log,(string *)&parameters,(string *)&src);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::~string((string *)&parameters);
  p_Var1 = &parameters._M_t._M_impl.super__Rb_tree_header;
  parameters._M_t._M_impl._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
  std::operator<<((ostream *)p_Var1,(string *)&fragmentShaderInfoLog);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&parameters,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var1);
  tcu::ScopedLogSection::~ScopedLogSection(&infoLogSection);
  p_Var1 = &parameters._M_t._M_impl.super__Rb_tree_header;
  parameters._M_t._M_impl._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
  std::operator<<((ostream *)p_Var1,"Compilation result: ");
  if (bVar4) {
    pcVar15 = "Ok";
  }
  std::operator<<((ostream *)p_Var1,pcVar15);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&parameters,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var1);
  tcu::ScopedLogSection::~ScopedLogSection(&shaderSection);
  if (bVar3) {
    if (bVar4) {
      std::__cxx11::string::~string((string *)&fragmentShaderInfoLog);
      std::__cxx11::string::~string((string *)&conditions);
      pFVar2 = local_480;
      (*local_480->deleteShader)(pVar12.first);
      (*pFVar2->deleteShader)(shader);
      std::__cxx11::string::~string((string *)&fragmentShaderSource);
      std::__cxx11::string::~string((string *)&vertexShaderSource);
      pVar12.second = shader;
      return pVar12;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Fragment shader compilation failed","fragmentCompileOk",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
               ,0x1c5);
  }
  else {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Vertex shader compilation failed","vertexCompileOk",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
               ,0x1c4);
  }
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

pair<deUint32, deUint32> createAndAttachShaders (TestLog& log, glu::RenderContext& renderCtx, deUint32 program, const vector<Attribute>& attributes, bool attributeAliasing)
{
	const glw::Functions&	gl						= renderCtx.getFunctions();
	const string			vertexShaderSource		= createVertexShaderSource(renderCtx, attributes, attributeAliasing);
	const string			fragmentShaderSource	= createFragmentShaderSource(renderCtx, attributeAliasing);

	const deUint32			vertexShader			= gl.createShader(GL_VERTEX_SHADER);
	const deUint32			fragmentShader			= gl.createShader(GL_FRAGMENT_SHADER);

	try
	{
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader()");

		{
			const char* const vertexShaderString	= vertexShaderSource.c_str();
			const char* const fragmentShaderString	= fragmentShaderSource.c_str();

			gl.shaderSource(vertexShader, 1, &vertexShaderString, DE_NULL);
			gl.shaderSource(fragmentShader, 1, &fragmentShaderString, DE_NULL);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource()");
		}

		gl.compileShader(vertexShader);
		gl.compileShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader()");

		gl.attachShader(program, vertexShader);
		gl.attachShader(program, fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader()");

		{
			const bool		vertexCompileOk			= getShaderCompileStatus(gl, vertexShader);
			const bool		fragmentCompileOk		= getShaderCompileStatus(gl, fragmentShader);

			const string	vertexShaderInfoLog		= getShaderInfoLog(gl, vertexShader);
			const string	fragmentShaderInfoLog	= getShaderInfoLog(gl, fragmentShader);

			logShaders(log, vertexShaderSource, vertexShaderInfoLog, vertexCompileOk, fragmentShaderSource, fragmentShaderInfoLog, fragmentCompileOk);

			TCU_CHECK_MSG(vertexCompileOk, "Vertex shader compilation failed");
			TCU_CHECK_MSG(fragmentCompileOk, "Fragment shader compilation failed");
		}

		gl.deleteShader(vertexShader);
		gl.deleteShader(fragmentShader);

		return pair<deUint32, deUint32>(vertexShader, fragmentShader);
	}
	catch (...)
	{
		if (vertexShader != 0)
			gl.deleteShader(vertexShader);

		if (fragmentShader != 0)
			gl.deleteShader(fragmentShader);

		throw;
	}
}